

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t update_chunk_offsets(_internal_exr_context *ctxt,_internal_exr_seq_scratch *scratch)

{
  uint uVar1;
  _internal_exr_part *curpart;
  exr_result_t eVar2;
  uint uVar3;
  long in_RDX;
  char *pcVar4;
  long lVar5;
  _internal_exr_part *p_Var6;
  
  if (ctxt->parts == (_internal_exr_part **)0x0) {
    eVar2 = 3;
  }
  else {
    p_Var6 = *ctxt->parts;
    p_Var6->chunk_table_offset = in_RDX - (long)scratch;
    if (0 < ctxt->num_parts) {
      lVar5 = 0;
      do {
        curpart = ctxt->parts[lVar5];
        eVar2 = internal_exr_compute_tile_information(ctxt,curpart,0);
        if (eVar2 != 0) {
          return eVar2;
        }
        uVar3 = internal_exr_compute_chunk_offset_size(curpart);
        if ((int)uVar3 < 0) {
          if (curpart->name == (exr_attribute_t *)0x0) {
            pcVar4 = "<first>";
          }
          else {
            pcVar4 = (char *)((curpart->name->field_6).chlist)->entries;
          }
          eVar2 = (*ctxt->print_error)
                            (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\'",(ulong)uVar3,pcVar4
                             ,ctxt->print_error);
          return eVar2;
        }
        uVar1 = curpart->chunk_count;
        if ((int)uVar1 < 0) {
LAB_0011e73a:
          curpart->chunk_count = uVar3;
        }
        else if (uVar1 != uVar3) {
          pcVar4 = "<first>";
          if (curpart->name != (exr_attribute_t *)0x0) {
            pcVar4 = (char *)((curpart->name->field_6).chlist)->entries;
          }
          (*ctxt->print_error)
                    (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\', expect (%d)",(ulong)uVar1,
                     pcVar4,(ulong)uVar3);
          goto LAB_0011e73a;
        }
        if (p_Var6 != curpart) {
          curpart->chunk_table_offset = (long)p_Var6->chunk_count * 8 + p_Var6->chunk_table_offset;
        }
        lVar5 = lVar5 + 1;
        p_Var6 = curpart;
      } while (lVar5 < ctxt->num_parts);
    }
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

static exr_result_t
update_chunk_offsets (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_seq_scratch* scratch)
{
    struct _internal_exr_part *curpart, *prevpart;

    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt->parts) return EXR_ERR_INVALID_ARGUMENT;

    ctxt->parts[0]->chunk_table_offset =
        scratch->fileoff - (uint64_t) scratch->navail;
    prevpart = ctxt->parts[0];

    for (int p = 0; p < ctxt->num_parts; ++p)
    {
        curpart = ctxt->parts[p];

        rv = internal_exr_compute_tile_information (ctxt, curpart, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        int32_t ccount = internal_exr_compute_chunk_offset_size (curpart);
        if (ccount < 0)
        {
            rv = ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s'",
                ccount,
                (curpart->name ? curpart->name->string->str : "<first>"));
            break;
        }

        if (curpart->chunk_count < 0)
            curpart->chunk_count = ccount;
        else if (curpart->chunk_count != ccount)
        {
            /* fatal error or just ignore it? c++ seemed to just ignore it entirely, we can at least warn */
            /* rv = */
            ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s', expect (%d)",
                curpart->chunk_count,
                (curpart->name ? curpart->name->string->str : "<first>"),
                ccount);
            curpart->chunk_count = ccount;
        }
        if (prevpart != curpart)
            curpart->chunk_table_offset =
                prevpart->chunk_table_offset +
                sizeof (uint64_t) * (size_t) (prevpart->chunk_count);
        prevpart = curpart;
    }
    return rv;
}